

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O2

void __thiscall
embree::SphereFilterMultiHitTest::createSphere
          (SphereFilterMultiHitTest *this,RTCDevice device,RTCScene scene,float x,float y,float z,
          float r)

{
  undefined8 uVar1;
  float *pfVar2;
  
  uVar1 = rtcNewGeometry(device,0x32);
  pfVar2 = (float *)rtcSetNewGeometryBuffer(uVar1,1,0,0x9004,0x10,1);
  *pfVar2 = x;
  pfVar2[1] = y;
  pfVar2[2] = z;
  pfVar2[3] = r;
  rtcCommitGeometry(uVar1);
  rtcAttachGeometry(scene,uVar1);
  rtcReleaseGeometry(uVar1);
  return;
}

Assistant:

void createSphere(RTCDevice device, RTCScene scene, float x, float y, float z, float r)
    {
      RTCGeometry geom = rtcNewGeometry(device, RTC_GEOMETRY_TYPE_SPHERE_POINT);
      
      float* vertices = (float*)rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT4, 4 * sizeof(float), 1);
      vertices[0] = x; vertices[1] = y; vertices[2] = z; vertices[3] = r;
      
      rtcCommitGeometry(geom);
      rtcAttachGeometry(scene, geom);
      rtcReleaseGeometry(geom);
    }